

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::send_udp_packet_hostname_listen
          (session_impl *this,listen_socket_handle *sock,char *hostname,int port,span<const_char> p,
          error_code *ec,udp_send_flags_t flags)

{
  listen_socket_t *plVar1;
  __weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  plVar1 = listen_socket_handle::get(sock);
  if (plVar1 != (listen_socket_t *)0x0) {
    ::std::__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_50,
               (__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *)sock);
    ::std::__weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::listen_socket_t,void>(local_40,&local_50);
    send_udp_packet_hostname
              (this,(weak_ptr<libtorrent::aux::utp_socket_interface> *)local_40,hostname,port,p,ec,
               flags);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_50._M_refcount);
    return;
  }
  boost::system::error_code::operator=(ec,bad_descriptor);
  return;
}

Assistant:

void send_udp_packet_hostname_listen(aux::listen_socket_handle const& sock
				, char const* hostname
				, int port
				, span<char const> p
				, error_code& ec
				, udp_send_flags_t const flags)
			{
				listen_socket_t* s = sock.get();
				if (!s)
				{
					ec = boost::asio::error::bad_descriptor;
					return;
				}
				send_udp_packet_hostname(sock.get_ptr(), hostname, port, p, ec, flags);
			}